

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Synth::processMIDI(V2Synth *this,uint8_t *cmd)

{
  syWRonan *wsptr;
  bool *pbVar1;
  int *piVar2;
  byte bVar3;
  byte bVar4;
  V2ChanInfo *pVVar5;
  bool *pbVar6;
  int i_3;
  uint32_t uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  int i_2;
  int i_1;
  ulong uVar14;
  uint32_t uVar15;
  int i_4;
  V2Voice *this_00;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  
  bVar4 = *cmd;
  if (bVar4 != 0xfd) {
    wsptr = &this->ronan;
    pbVar1 = &this->voicesw[0].gate;
    do {
      if ((char)bVar4 < '\0') {
        cmd = cmd + 1;
        this->mrstat = (uint)bVar4;
        uVar10 = bVar4 & 0xf;
        switch(bVar4 >> 4 & 7) {
        case 0:
          goto switchD_00107e23_caseD_0;
        case 1:
          goto switchD_00107e23_caseD_1;
        case 2:
          goto switchD_00107e23_caseD_2;
        case 3:
          goto switchD_00107e23_caseD_3;
        case 4:
          goto switchD_00107e23_caseD_4;
        case 7:
          goto switchD_00107e23_caseD_7;
        }
        goto switchD_00107e23_caseD_5;
      }
      uVar17 = this->mrstat;
      if (uVar17 < 0x80) {
        return;
      }
      uVar10 = uVar17 & 0xf;
      switch(uVar17 >> 4 & 7) {
      case 0:
switchD_00107e23_caseD_0:
        if (uVar10 == 0xf) {
          ronanCBNoteOff((syWRonan *)wsptr);
        }
        lVar8 = 0;
        pbVar6 = pbVar1;
        do {
          if (((this->chanmap[lVar8] == uVar10) && (((V2Voice *)(pbVar6 + -8))->note == (uint)*cmd))
             && (*pbVar6 == true)) {
            *pbVar6 = false;
          }
          lVar8 = lVar8 + 1;
          pbVar6 = pbVar6 + 0x2d8;
        } while (lVar8 != 0x40);
      default:
switchD_00107e23_caseD_5:
        cmd = cmd + 2;
        break;
      case 1:
switchD_00107e23_caseD_1:
        if (cmd[1] == 0) goto switchD_00107e23_caseD_0;
        if (uVar10 == 0xf) {
          ronanCBNoteOn((syWRonan *)wsptr);
        }
        lVar8 = (long)(char)this->chans[uVar10].pgm;
        if (lVar8 < 0) {
          __assert_fail("pgm >= 0 && pgm < 128",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                        ,0xbdc,"const V2Sound *V2Synth::getpatch(int) const");
        }
        iVar16 = 0;
        iVar18 = 0;
        iVar19 = 0;
        iVar20 = 0;
        lVar11 = 5;
        do {
          piVar2 = this->chanmap + lVar11 + -5;
          iVar16 = iVar16 + (uint)(*piVar2 == uVar10);
          iVar18 = iVar18 + (uint)(piVar2[1] == uVar10);
          iVar19 = iVar19 + (uint)(piVar2[2] == uVar10);
          iVar20 = iVar20 + (uint)(piVar2[3] == uVar10);
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x45);
        uVar17 = iVar20 + iVar18 + iVar19 + iVar16;
        if ((uVar17 == 0) ||
           (uVar9 = 0xf, uVar13 = uVar10,
           uVar17 < this->patchmap->raw_data[(ulong)this->patchmap->offsets[lVar8] + 0x58])) {
          uVar12 = 0;
          do {
            if (this->chanmap[uVar12] < 0) {
              uVar7 = this->curalloc;
              goto LAB_00108100;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 0x40);
          uVar9 = 0;
          uVar13 = 0;
        }
        uVar7 = this->curalloc;
        uVar12 = 0xffffffff;
        uVar14 = 0;
        pbVar6 = pbVar1;
        uVar15 = uVar7;
        do {
          if ((((this->chanmap[uVar14] & uVar9) == uVar13) && (*pbVar6 == false)) &&
             (this->allocpos[uVar14] < uVar15)) {
            uVar12 = uVar14 & 0xffffffff;
            uVar15 = this->allocpos[uVar14];
          }
          uVar14 = uVar14 + 1;
          pbVar6 = pbVar6 + 0x2d8;
        } while (uVar14 != 0x40);
        if ((int)uVar12 < 0) {
          uVar14 = 0;
          uVar15 = uVar7;
          do {
            if (((this->chanmap[uVar14] & uVar9) == uVar13) && (this->allocpos[uVar14] < uVar15)) {
              uVar12 = uVar14 & 0xffffffff;
              uVar15 = this->allocpos[uVar14];
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != 0x40);
          if ((int)uVar12 < 0) {
            __assert_fail("usevoice >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jgilje[P]v2m-player/src/synth_core.cpp"
                          ,0xb3d,"void V2Synth::processMIDI(const uint8_t *)");
          }
        }
LAB_00108100:
        uVar14 = uVar12 & 0xffffffff;
        this->chanmap[uVar14] = uVar10;
        this->voicemap[uVar10] = (int)uVar12;
        this->curalloc = uVar7 + 1;
        this->allocpos[uVar14] = uVar7;
        storeV2Values(this,(int)uVar12);
        V2Voice::noteOn(this->voicesw + uVar14,(uint)*cmd,(uint)cmd[1]);
        goto switchD_00107e23_caseD_5;
      case 2:
switchD_00107e23_caseD_2:
        cmd = cmd + 1;
        break;
      case 3:
switchD_00107e23_caseD_3:
        bVar4 = *cmd;
        if ((byte)(bVar4 - 1) < 7) {
          bVar3 = cmd[1];
          this->chans[uVar10].ctl[bVar4 - 1] = bVar3;
          if (uVar10 == 0xf) {
            ronanCBSetCtl((syWRonan *)wsptr,(uint)bVar4,(uint)bVar3);
          }
        }
        else if (bVar4 == 0x7b) {
          if (uVar10 == 0xf) {
            ronanCBNoteOff((syWRonan *)wsptr);
          }
          lVar8 = 0;
          pbVar6 = pbVar1;
          do {
            if (this->chanmap[lVar8] == uVar10) {
              *pbVar6 = false;
            }
            lVar8 = lVar8 + 1;
            pbVar6 = pbVar6 + 0x2d8;
          } while (lVar8 != 0x40);
        }
        else if (bVar4 == 0x78) {
          lVar8 = 0;
          this_00 = this->voicesw;
          do {
            if (this->chanmap[lVar8] == uVar10) {
              V2Voice::init(this_00,(EVP_PKEY_CTX *)&this->instance);
              this->chanmap[lVar8] = -1;
            }
            lVar8 = lVar8 + 1;
            this_00 = this_00 + 1;
          } while (lVar8 != 0x40);
        }
        cmd = cmd + 2;
        break;
      case 4:
switchD_00107e23_caseD_4:
        pVVar5 = this->chans + uVar10;
        if (pVVar5->pgm != (*cmd & 0x7f)) {
          pVVar5->pgm = *cmd & 0x7f;
          lVar8 = 0;
          do {
            piVar2 = this->chanmap + lVar8;
            uVar17 = piVar2[1];
            uVar13 = piVar2[2];
            uVar9 = piVar2[3];
            if (*piVar2 == uVar10) {
              this->chanmap[lVar8] = -1;
            }
            if (uVar17 == uVar10) {
              this->chanmap[lVar8 + 1] = -1;
            }
            if (uVar13 == uVar10) {
              this->chanmap[lVar8 + 2] = -1;
            }
            if (uVar9 == uVar10) {
              this->chanmap[lVar8 + 3] = -1;
            }
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0x40);
        }
        cmd = cmd + 1;
        pVVar5->ctl[4] = '\0';
        pVVar5->ctl[5] = '\0';
        pVVar5->ctl[0] = '\0';
        pVVar5->ctl[1] = '\0';
        pVVar5->ctl[2] = '\0';
        pVVar5->ctl[3] = '\0';
        break;
      case 7:
switchD_00107e23_caseD_7:
        if (uVar10 == 0xf) {
          init(this,(EVP_PKEY_CTX *)this->patchmap->raw_data);
        }
      }
      bVar4 = *cmd;
    } while (bVar4 != 0xfd);
  }
  return;
}

Assistant:

void processMIDI(const uint8_t *cmd)
    {
        while (*cmd != 0xfd) // until end of stream
        {
            if (*cmd & 0x80) // start of message
                mrstat = *cmd++;

            if (mrstat < 0x80) // we don't have a current message? uhm...
                break;

            int chan = mrstat & 0xf;
            switch ((mrstat >> 4) & 7)
            {
            case 1: // Note on
                if (cmd[1] != 0) // velocity==0 is actually a note off
                {
                    COVER("MIDI note on");
                    if (chan == CHANS - 1)
                        ronanCBNoteOn(&ronan);

                    // calculate current polyphony for this channel
                    const V2Sound *sound = getpatch(chans[chan].pgm);
                    int npoly = 0;
                    for (int i = 0; i < POLY; i++)
                        npoly += (chanmap[i] == chan);

                    // voice allocation. this is equivalent to the original V2 code,
                    // but hopefully simpler to follow.
                    int usevoice = -1;
                    int chanmask, chanfind;

                    if (!npoly || npoly < sound->maxpoly) // even if maxpoly is 0, allow at least 1.
                    {
                        // if we haven't reached polyphony limit yet, try to find a free voice
                        // first.
                        for (int i=0; i < POLY; i++)
                        {
                            if (chanmap[i] < 0)
                            {
                                usevoice = i;
                                break;
                            }
                        }

                        // okay, need to find a free voice. we'll take any channel.
                        COVER("SYN find voice any");
                        chanmask = 0;
                        chanfind = 0;
                    } else
                    {
                        // if we're at polyphony limit, we know there's at least one voice
                        // used by this channel, so we can limit ourselves to killing
                        // voices from our own chan.
                        COVER("SYN find voice channel");
                        chanmask = 0xf;
                        chanfind = chan;
                    }

                    // don't have a voice yet? kill oldest eligible one with gate off.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice gate off");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && !voicesw[i].gate && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // still no voice? okay, just take the oldest one we can find, period.
                    if (usevoice < 0)
                    {
                        COVER("SYN replace voice oldest");
                        uint32_t oldest = curalloc;
                        for (int i = 0; i < POLY; i++)
                        {
                            if ((chanmap[i] & chanmask) == chanfind && allocpos[i] < oldest)
                            {
                                oldest = allocpos[i];
                                usevoice = i;
                            }
                        }
                    }

                    // we have our voice - assign it!
                    assert(usevoice >= 0);
                    chanmap[usevoice] = chan;
                    voicemap[chan] = usevoice;
                    allocpos[usevoice] = curalloc++;

                    // and note on!
                    storeV2Values(usevoice);
                    voicesw[usevoice].noteOn(cmd[0], cmd[1]);
                    cmd += 2;
                    break;
                }
                // fall-through (for when we had a note off)

            case 0: // Note off
                COVER("MIDI note off");
                if (chan == CHANS - 1)
                    ronanCBNoteOff(&ronan);

                for (int i = 0; i < POLY; i++)
                {
                    if (chanmap[i] != chan)
                        continue;
                    V2Voice *voice = &voicesw[i];
                    if (voice->note == cmd[0] && voice->gate)
                        voice->noteOff();
                }
                cmd += 2;
                break;

            case 2: // Aftertouch
                COVER("MIDI aftertouch");
                cmd++; // ignored
                break;

            case 3: // Control change
            {
                COVER("MIDI controller change");
                int ctrl = cmd[0];
                uint8_t val = cmd[1];
                if (ctrl >= 1 && ctrl <= 7)
                {
                    chans[chan].ctl[ctrl - 1] = val;
                    if (chan == CHANS-1)
                        ronanCBSetCtl(&ronan, ctrl, val);
                }
                else if (ctrl == 120) // CC #120: all sound off
                {
                    COVER("MIDI CC all sound off");
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] != chan)
                            continue;

                        voicesw[i].init(&instance);
                        chanmap[i] = -1;
                    }
                }
                else if (ctrl == 123) // CC #123: all notes off
                {
                    COVER("MIDI CC all notes off");
                    if (chan == CHANS-1)
                        ronanCBNoteOff(&ronan);

                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            voicesw[i].noteOff();
                    }
                }
                cmd += 2;
                break;
            }

            case 4: // Program change
            {
                COVER("MIDI program change");
                uint8_t pgm = *cmd++ & 0x7f;
                // did the program actually change?
                if (chans[chan].pgm != pgm)
                {
                    COVER("MIDI program change real");
                    chans[chan].pgm = pgm;

                    // need to turn all voices on this channel off.
                    for (int i=0; i < POLY; i++)
                    {
                        if (chanmap[i] == chan)
                            chanmap[i] = -1;
                    }
                }

                // either way, reset controllers
                for (int i=0; i < 6; i++)
                    chans[chan].ctl[i] = 0;
                break;
            }

            case 5: // Pitch bend
                COVER("MIDI pitch bend");
                cmd += 2; // ignored
                break;

            case 6: // Poly Aftertouch
                COVER("MIDI poly aftertouch");
                cmd += 2; // ignored
                break;

            case 7: // System
                COVER("MIDI system exclusive");
                if (chan == 0xf) // Reset
                    init(patchmap, samplerate);
                break; // rest ignored
            }
        }
    }